

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::EndObject
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType memberCount)

{
  unsigned_long *puVar1;
  uint64_t uVar2;
  uint local_2c;
  SizeType i;
  uint64_t *kv;
  uint64_t h;
  SizeType memberCount_local;
  Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  kv = (uint64_t *)Hash(0,3);
  puVar1 = Stack<rapidjson::CrtAllocator>::Pop<unsigned_long>
                     (&this->stack_,(ulong)(memberCount << 1));
  for (local_2c = 0; local_2c < memberCount; local_2c = local_2c + 1) {
    uVar2 = Hash(0,puVar1[local_2c << 1]);
    uVar2 = Hash(uVar2,puVar1[local_2c * 2 + 1]);
    kv = (uint64_t *)(uVar2 ^ (ulong)kv);
  }
  puVar1 = Stack<rapidjson::CrtAllocator>::Push<unsigned_long>(&this->stack_,1);
  *puVar1 = (unsigned_long)kv;
  return true;
}

Assistant:

bool EndObject(SizeType memberCount) { 
        uint64_t h = Hash(0, kObjectType);
        uint64_t* kv = stack_.template Pop<uint64_t>(memberCount * 2);
        for (SizeType i = 0; i < memberCount; i++)
            // Issue #2205
            // Hasing the key to avoid key=value cases with bug-prone zero-value hash
            h ^= Hash(Hash(0, kv[i * 2]), kv[i * 2 + 1]);  // Use xor to achieve member order insensitive
        *stack_.template Push<uint64_t>() = h;
        return true;
    }